

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O0

int UUID_from_string(char *uuid_string,UUID_T *uuid)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  LOGGER_LOG l_3;
  int lowerOrderDigit;
  int higherOrderDigit;
  LOGGER_LOG l_2;
  char *uuid_bytes;
  size_t j;
  size_t i;
  LOGGER_LOG l_1;
  size_t uuid_string_length;
  LOGGER_LOG l;
  int result;
  UUID_T *uuid_local;
  char *uuid_string_local;
  
  if ((uuid_string == (char *)0x0) || (uuid == (UUID_T *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
                ,"UUID_from_string",0x21,1,"Invalid argument (uuid_string=%p, uuid=%p)",uuid_string,
                uuid);
    }
    l._4_4_ = 0x22;
  }
  else {
    sVar2 = strlen(uuid_string);
    if (sVar2 == 0x24) {
      l._4_4_ = 0;
      j = 0;
      uuid_bytes = (char *)0x0;
      while (j < 0x24) {
        if (uuid_string[j] == '-') {
          if ((((j != 8) && (j != 0xd)) && (j != 0x12)) && (j != 0x17)) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
                        ,"UUID_from_string",0x3e,1,"Failed decoding UUID string (%lu)",j);
            }
            return 0x3f;
          }
          j = j + 1;
        }
        else {
          if ((uuid_string[j] < '0') || ('9' < uuid_string[j])) {
            if ((uuid_string[j] < 'a') || ('f' < uuid_string[j])) {
              if ((uuid_string[j] < 'A') || ('F' < uuid_string[j])) {
                local_74 = -1;
              }
              else {
                local_74 = uuid_string[j] + -0x37;
              }
              local_70 = local_74;
            }
            else {
              local_70 = uuid_string[j] + -0x57;
            }
            local_6c = local_70;
          }
          else {
            local_6c = uuid_string[j] + -0x30;
          }
          if ((uuid_string[j + 1] < '0') || ('9' < uuid_string[j + 1])) {
            if ((uuid_string[j + 1] < 'a') || ('f' < uuid_string[j + 1])) {
              if ((uuid_string[j + 1] < 'A') || ('F' < uuid_string[j + 1])) {
                local_80 = -1;
              }
              else {
                local_80 = uuid_string[j + 1] + -0x37;
              }
              local_7c = local_80;
            }
            else {
              local_7c = uuid_string[j + 1] + -0x57;
            }
            local_78 = local_7c;
          }
          else {
            local_78 = uuid_string[j + 1] + -0x30;
          }
          if ((local_6c == -1) || (local_78 == -1)) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
                        ,"UUID_from_string",0x55,1,"Failed decoding UUID string (%lu)",j);
            }
            return 0x56;
          }
          uuid_bytes[(long)*uuid] = (char)(local_6c << 4) + (char)local_78;
          j = j + 2;
          uuid_bytes = uuid_bytes + 1;
        }
      }
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
                  ,"UUID_from_string",0x2a,1,"Unexpected size for an UUID string (%lu)",sVar2);
      }
      l._4_4_ = 0x2b;
    }
  }
  return l._4_4_;
}

Assistant:

int UUID_from_string(const char* uuid_string, UUID_T* uuid)
{
    int result;

    // Codes_SRS_UUID_09_007: [ If uuid_string or uuid are NULL, UUID_from_string shall return a non-zero value ]
    if (uuid_string == NULL || uuid == NULL)
    {
        LogError("Invalid argument (uuid_string=%p, uuid=%p)", uuid_string, uuid);
        result = MU_FAILURE;
    }
    else
    {
        size_t uuid_string_length = strlen(uuid_string);

        if (uuid_string_length != UUID_STRING_LENGTH)
        {
            LogError("Unexpected size for an UUID string (%lu)", (unsigned long)uuid_string_length);
            result = MU_FAILURE;
        }
        else
        {
            // Codes_SRS_UUID_09_008: [ Each pair of digits in uuid_string, excluding dashes, shall be read as a single HEX value and saved on the respective position in uuid ]
            size_t i, j;
            char* uuid_bytes;

            uuid_bytes = (char *)uuid;
            // Codes_SRS_UUID_09_010: [ If no failures occur, UUID_from_string shall return zero ]
            result = __SUCCESS__;

            for (i = 0, j = 0; i < uuid_string_length; )
            {
                if (uuid_string[i] == '-')
                {
                    if (!MUST_BE_DASH(i))
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        i++;
                    }
                }
                else
                {
                    int higherOrderDigit = HEXA_DIGIT_VAL(uuid_string[i]);
                    int lowerOrderDigit = HEXA_DIGIT_VAL(uuid_string[i + 1]);

#ifdef _MSC_VER
#pragma warning(disable:6328) // warning C6328: Size mismatch
#endif
                    if (higherOrderDigit == -1 || lowerOrderDigit == -1)
#ifdef _MSC_VER
#pragma warning (default:6328)
#endif
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        // Multiplying the higherOrderDigit by 16.
                        uuid_bytes[j] = (char)((higherOrderDigit << 4) + lowerOrderDigit);
                        i += 2;
                        j++;
                    }
                }
            }
        }
    }

    return result;
}